

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_resilience_test.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_767bfd::ErrorResilienceTestLarge::DoDecode(ErrorResilienceTestLarge *this)

{
  ostream *poVar1;
  ulong uVar2;
  
  if (((ulong)this->error_nframes_ != 0) &&
     (((this->super_EncoderTest).cfg_.g_pass & ~AOM_RC_LAST_PASS) == AOM_RC_ONE_PASS)) {
    uVar2 = 0;
    do {
      if (this->error_frames_[uVar2] == this->nframes_ - 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"             Skipping decoding frame: ",0x26);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
        return false;
      }
      uVar2 = uVar2 + 1;
    } while (this->error_nframes_ != uVar2);
  }
  return true;
}

Assistant:

bool DoDecode() const override {
    if (error_nframes_ > 0 &&
        (cfg_.g_pass == AOM_RC_LAST_PASS || cfg_.g_pass == AOM_RC_ONE_PASS)) {
      for (unsigned int i = 0; i < error_nframes_; ++i) {
        if (error_frames_[i] == nframes_ - 1) {
          std::cout << "             Skipping decoding frame: "
                    << error_frames_[i] << "\n";
          return false;
        }
      }
    }
    return true;
  }